

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O3

void __thiscall
t_swift_generator::generate_old_swift_struct_result_writer
          (t_swift_generator *this,ostream *out,t_struct *tstruct)

{
  long lVar1;
  t_field *ptVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pptVar5;
  string name;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"private static func writeValue(__value: ",0x28);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,", toProtocol __proto: TProtocol) throws",0x27);
  block_open(this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_70 = local_60;
  lVar1 = *(long *)CONCAT44(extraout_var_00,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar1,((long *)CONCAT44(extraout_var_00,iVar3))[1] + lVar1);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"try __proto.writeStructBeginWithName(\"",0x26);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\")",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    ptVar2 = *pptVar5;
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if let result = __value.",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,((*pptVar5)->name_)._M_dataplus._M_p,((*pptVar5)->name_)._M_string_length);
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"try __proto.writeFieldValue(result, ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"name: \"",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\", ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"type: ",6);
    type_to_enum_abi_cxx11_(&local_50,this,ptVar2->type_,false);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"id: ",4);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,ptVar2->key_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    block_close(this,out,true);
  }
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try __proto.writeFieldStop()",0x1c);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try __proto.writeStructEnd()",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void t_swift_generator::generate_old_swift_struct_result_writer(ostream& out, t_struct* tstruct) {

  indent(out) << "private static func writeValue(__value: " << tstruct->get_name()
              << ", toProtocol __proto: TProtocol) throws";
  block_open(out);
  out << endl;
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "try __proto.writeStructBeginWithName(\"" << name << "\")" << endl;
  out << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field *tfield = *f_iter;

    indent(out) << "if let result = __value." << (*f_iter)->get_name();

    block_open(out);

    indent(out) << "try __proto.writeFieldValue(result, "
                << "name: \"" << tfield->get_name() << "\", "
                << "type: " << type_to_enum(tfield->get_type()) << ", "
                << "id: " << tfield->get_key() << ")" << endl;

    block_close(out);
  }
  // Write the struct map
  indent(out) << "try __proto.writeFieldStop()" << endl << endl;
  indent(out) << "try __proto.writeStructEnd()" << endl;
  block_close(out);
  out << endl;
}